

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roundtrip.cpp
# Opt level: O0

shared_ptr<int> (anonymous_namespace)::roundtrip<std::shared_ptr<int>>(shared_ptr<int> *in)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  shared_ptr<int> sVar1;
  shared_ptr<int> *out;
  shared_ptr<int> *in_stack_000001f8;
  shared_ptr<int> *in_stack_00000200;
  
  std::shared_ptr<int>::shared_ptr((shared_ptr<int> *)0x152984);
  roundtrip_into<std::shared_ptr<int>,std::shared_ptr<int>>(in_stack_00000200,in_stack_000001f8);
  sVar1.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<int>)sVar1.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

T roundtrip(const T& in)
{
  T out;
  roundtrip_into(in, out);
  return out;
}